

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O2

void llvm::yaml::skip<llvm::yaml::SequenceNode>(SequenceNode *C)

{
  Node *pNVar1;
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> local_18;
  iterator i;
  
  if (C->IsAtBeginning == false) {
    if (C->IsAtEnd == false) {
      __assert_fail("(C.IsAtBeginning || C.IsAtEnd) && \"Cannot skip mid parse!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                    ,0x186,
                    "void llvm::yaml::skip(CollectionType &) [CollectionType = llvm::yaml::SequenceNode]"
                   );
    }
  }
  else {
    local_18.Base = (SequenceNode *)begin<llvm::yaml::SequenceNode>(C);
    while (local_18.Base != (SequenceNode *)0x0) {
      pNVar1 = basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator->
                         (&local_18);
      (*pNVar1->_vptr_Node[1])(pNVar1);
      basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void skip(CollectionType &C) {
  // TODO: support skipping from the middle of a parsed collection ;/
  assert((C.IsAtBeginning || C.IsAtEnd) && "Cannot skip mid parse!");
  if (C.IsAtBeginning)
    for (typename CollectionType::iterator i = begin(C), e = C.end(); i != e;
         ++i)
      i->skip();
}